

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::print_container<std::vector<int,std::allocator<int>>,char_const&>
               (ostream *os,vector<int,_std::allocator<int>_> *container,char *ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<int,_char> local_60;
  int *local_50;
  int *field;
  const_iterator __end0;
  const_iterator __begin0;
  vector<int,_std::allocator<int>_> *__range2;
  char *sep;
  char *ctx_local;
  vector<int,_std::allocator<int>_> *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (vector<int,_std::allocator<int>_> *)0x1060b6;
  __end0 = std::vector<int,_std::allocator<int>_>::begin(container);
  field = (int *)std::vector<int,_std::allocator<int>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                *)&field);
    if (!bVar1) break;
    local_50 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
    os_00 = std::operator<<(os,(char *)__range2);
    local_60 = json<int,char>(local_50,ctx);
    operator<<(os_00,&local_60);
    __range2 = (vector<int,_std::allocator<int>_> *)anon_var_dwarf_53bb;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}